

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O2

DdNode * addMMRecur(DdManager *dd,DdNode *A,DdNode *B,int topP,int *vars)

{
  int *piVar1;
  uint topP_00;
  DdNode *pDVar2;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  ulong uVar8;
  DdNode *B_00;
  uint uVar9;
  uint uVar10;
  double dVar11;
  
  pDVar7 = dd->zero;
  if (pDVar7 == B || pDVar7 == A) {
    return pDVar7;
  }
  if ((A->index == 0x7fffffff) && (B->index == 0x7fffffff)) {
    dVar11 = (A->type).value * (B->type).value;
    uVar8 = 0;
    uVar4 = (ulong)(uint)dd->size;
    if (dd->size < 1) {
      uVar4 = uVar8;
    }
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      if ((vars[uVar8] != 0) && (topP < dd->perm[uVar8])) {
        dVar11 = dVar11 + dVar11;
      }
    }
    pDVar7 = cuddUniqueConst(dd,dVar11);
    return pDVar7;
  }
  pDVar3 = A;
  if (B < A) {
    pDVar3 = B;
    B = A;
  }
  uVar9 = 0x7fffffff;
  uVar10 = 0x7fffffff;
  if ((ulong)pDVar3->index != 0x7fffffff) {
    uVar10 = dd->perm[pDVar3->index];
  }
  if ((ulong)B->index != 0x7fffffff) {
    uVar9 = dd->perm[B->index];
  }
  topP_00 = uVar10;
  if (uVar9 < uVar10) {
    topP_00 = uVar9;
  }
  pDVar2 = cuddCacheLookup2(dd,addMMRecur,pDVar3,B);
  if (pDVar2 != (DdNode *)0x0) {
    if (pDVar2 == pDVar7) {
      return pDVar2;
    }
    uVar8 = 0;
    uVar4 = (ulong)(uint)dd->size;
    if (dd->size < 1) {
      uVar4 = uVar8;
    }
    dVar11 = 1.0;
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      if (((vars[uVar8] != 0) && (topP < dd->perm[uVar8])) && ((uint)dd->perm[uVar8] < topP_00)) {
        dVar11 = dVar11 + dVar11;
      }
    }
    if (dVar11 <= 1.0) {
      return pDVar2;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar7 = cuddUniqueConst(dd,dVar11);
    if (pDVar7 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = cuddAddApplyRecur(dd,Cudd_addTimes,pDVar2,pDVar7);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar7);
        Cudd_RecursiveDeref(dd,pDVar2);
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar3;
      }
      Cudd_RecursiveDeref(dd,pDVar7);
    }
    goto LAB_0061f9ab;
  }
  pDVar5 = pDVar3;
  pDVar2 = pDVar3;
  if (uVar10 <= uVar9) {
    pDVar2 = (pDVar3->type).kids.T;
    pDVar5 = (pDVar3->type).kids.E;
  }
  B_00 = B;
  pDVar6 = B;
  if (uVar9 <= uVar10) {
    pDVar6 = (B->type).kids.T;
    B_00 = (B->type).kids.E;
  }
  pDVar2 = addMMRecur(dd,pDVar2,pDVar6,topP_00,vars);
  if (pDVar2 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  uVar4 = (ulong)pDVar2 & 0xfffffffffffffffe;
  *(int *)(uVar4 + 4) = *(int *)(uVar4 + 4) + 1;
  pDVar5 = addMMRecur(dd,pDVar5,B_00,topP_00,vars);
  if (pDVar5 == (DdNode *)0x0) goto LAB_0061f9ab;
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (vars[dd->invperm[topP_00]] == 0) {
    uVar8 = uVar4;
    if (pDVar2 != pDVar5) {
      pDVar6 = cuddUniqueInter(dd,dd->invperm[topP_00],pDVar2,pDVar5);
      if (pDVar6 == (DdNode *)0x0) goto LAB_0061f99e;
      uVar8 = (ulong)pDVar6 & 0xfffffffffffffffe;
      pDVar2 = pDVar6;
    }
    *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
    *(int *)(uVar4 + 4) = *(int *)(uVar4 + 4) + -1;
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  else {
    pDVar6 = cuddAddApplyRecur(dd,Cudd_addPlus,pDVar2,pDVar5);
    if (pDVar6 == (DdNode *)0x0) {
LAB_0061f99e:
      Cudd_RecursiveDeref(dd,pDVar2);
      pDVar2 = pDVar5;
      goto LAB_0061f9ab;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar2);
    Cudd_RecursiveDeref(dd,pDVar5);
    pDVar2 = pDVar6;
  }
  cuddCacheInsert2(dd,addMMRecur,pDVar3,B,pDVar2);
  pDVar3 = pDVar2;
  if (pDVar2 != pDVar7) {
    uVar8 = 0;
    uVar4 = (ulong)(uint)dd->size;
    if (dd->size < 1) {
      uVar4 = uVar8;
    }
    dVar11 = 1.0;
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      if (((vars[uVar8] != 0) && (topP < dd->perm[uVar8])) && ((uint)dd->perm[uVar8] < topP_00)) {
        dVar11 = dVar11 + dVar11;
      }
    }
    if (1.0 < dVar11) {
      pDVar7 = cuddUniqueConst(dd,dVar11);
      if (pDVar7 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar3 = cuddAddApplyRecur(dd,Cudd_addTimes,pDVar2,pDVar7);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar7);
          Cudd_RecursiveDeref(dd,pDVar2);
          goto LAB_0061f97f;
        }
        Cudd_RecursiveDeref(dd,pDVar2);
        pDVar2 = pDVar7;
      }
LAB_0061f9ab:
      Cudd_RecursiveDeref(dd,pDVar2);
      return (DdNode *)0x0;
    }
  }
LAB_0061f97f:
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar3;
}

Assistant:

static DdNode *
addMMRecur(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  int  topP,
  int * vars)
{
    DdNode *zero,
           *At,         /* positive cofactor of first operand */
           *Ae,         /* negative cofactor of first operand */
           *Bt,         /* positive cofactor of second operand */
           *Be,         /* negative cofactor of second operand */
           *t,          /* positive cofactor of result */
           *e,          /* negative cofactor of result */
           *scaled,     /* scaled result */
           *add_scale,  /* ADD representing the scaling factor */
           *res;
    int i;              /* loop index */
    double scale;       /* scaling factor */
    int index;          /* index of the top variable */
    CUDD_VALUE_TYPE value;
    unsigned int topA, topB, topV;
    DD_CTFP cacheOp;

    statLine(dd);
    zero = DD_ZERO(dd);

    if (A == zero || B == zero) {
        return(zero);
    }

    if (cuddIsConstant(A) && cuddIsConstant(B)) {
        /* Compute the scaling factor. It is 2^k, where k is the
        ** number of summation variables below the current variable.
        ** Indeed, these constants represent blocks of 2^k identical
        ** constant values in both A and B.
        */
        value = cuddV(A) * cuddV(B);
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP) {
                    value *= (CUDD_VALUE_TYPE) 2;
                }
            }
        }
        res = cuddUniqueConst(dd, value);
        return(res);
    }

    /* Standardize to increase cache efficiency. Clearly, A*B != B*A
    ** in matrix multiplication. However, which matrix is which is
    ** determined by the variables appearing in the ADDs and not by
    ** which one is passed as first argument.
    */
    if (A > B) {
        DdNode *tmp = A;
        A = B;
        B = tmp;
    }

    topA = cuddI(dd,A->index); topB = cuddI(dd,B->index);
    topV = ddMin(topA,topB);

    cacheOp = (DD_CTFP) addMMRecur;
    res = cuddCacheLookup2(dd,cacheOp,A,B);
    if (res != NULL) {
        /* If the result is 0, there is no need to normalize.
        ** Otherwise we count the number of z variables between
        ** the current depth and the top of the ADDs. These are
        ** the missing variables that determine the size of the
        ** constant blocks.
        */
        if (res == zero) return(res);
        scale = 1.0;
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP && (unsigned) dd->perm[i] < topV) {
                    scale *= 2;
                }
            }
        }
        if (scale > 1.0) {
            cuddRef(res);
            add_scale = cuddUniqueConst(dd,(CUDD_VALUE_TYPE)scale);
            if (add_scale == NULL) {
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(add_scale);
            scaled = cuddAddApplyRecur(dd,Cudd_addTimes,res,add_scale);
            if (scaled == NULL) {
                Cudd_RecursiveDeref(dd, add_scale);
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(scaled);
            Cudd_RecursiveDeref(dd, add_scale);
            Cudd_RecursiveDeref(dd, res);
            res = scaled;
            cuddDeref(res);
        }
        return(res);
    }

    /* compute the cofactors */
    if (topV == topA) {
        At = cuddT(A);
        Ae = cuddE(A);
    } else {
        At = Ae = A;
    }
    if (topV == topB) {
        Bt = cuddT(B);
        Be = cuddE(B);
    } else {
        Bt = Be = B;
    }

    t = addMMRecur(dd, At, Bt, (int)topV, vars);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = addMMRecur(dd, Ae, Be, (int)topV, vars);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    index = dd->invperm[topV];
    if (vars[index] == 0) {
        /* We have split on either the rows of A or the columns
        ** of B. We just need to connect the two subresults,
        ** which correspond to two submatrices of the result.
        */
        res = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        cuddDeref(t);
        cuddDeref(e);
    } else {
        /* we have simultaneously split on the columns of A and
        ** the rows of B. The two subresults must be added.
        */
        res = cuddAddApplyRecur(dd,Cudd_addPlus,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
    }

    cuddCacheInsert2(dd,cacheOp,A,B,res);

    /* We have computed (and stored in the computed table) a minimal
    ** result; that is, a result that assumes no summation variables
    ** between the current depth of the recursion and its top
    ** variable. We now take into account the z variables by properly
    ** scaling the result.
    */
    if (res != zero) {
        scale = 1.0;
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP && (unsigned) dd->perm[i] < topV) {
                    scale *= 2;
                }
            }
        }
        if (scale > 1.0) {
            add_scale = cuddUniqueConst(dd,(CUDD_VALUE_TYPE)scale);
            if (add_scale == NULL) {
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(add_scale);
            scaled = cuddAddApplyRecur(dd,Cudd_addTimes,res,add_scale);
            if (scaled == NULL) {
                Cudd_RecursiveDeref(dd, res);
                Cudd_RecursiveDeref(dd, add_scale);
                return(NULL);
            }
            cuddRef(scaled);
            Cudd_RecursiveDeref(dd, add_scale);
            Cudd_RecursiveDeref(dd, res);
            res = scaled;
        }
    }
    cuddDeref(res);
    return(res);

}